

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O0

string * errormsg(string *__return_storage_ptr__,string *s)

{
  _Ios_Openmode _Var1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  int local_1d4;
  int local_1d0;
  int i_1;
  int i;
  stringstream local_1c0 [8];
  stringstream ss;
  ostream local_1b0 [376];
  string local_38 [8];
  string temp;
  string *s_local;
  
  temp.field_2._8_8_ = s;
  std::__cxx11::string::string(local_38);
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1c0,local_38,_Var1);
  iVar2 = Lineno::start(&ln);
  iVar3 = Lineno::next(&ln);
  if (iVar2 < iVar3) {
    std::operator<<(local_1b0,"  | ");
    local_1d0 = 0;
    while( true ) {
      iVar2 = Lineno::start(&ln);
      if (iVar2 + -1 <= local_1d0) break;
      std::operator<<(local_1b0,' ');
      local_1d0 = local_1d0 + 1;
    }
    local_1d4 = Lineno::start(&ln);
    while( true ) {
      iVar2 = Lineno::next(&ln);
      if (iVar2 <= local_1d4) break;
      std::operator<<(local_1b0,'^');
      local_1d4 = local_1d4 + 1;
    }
    poVar4 = std::operator<<(local_1b0,anon_var_dwarf_469e1 + 0xb78);
    poVar4 = std::operator<<(poVar4,"  | ");
    poVar4 = std::operator<<(poVar4,"line ");
    iVar2 = Lineno::lineno(&ln);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,",");
    iVar2 = Lineno::start(&ln);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,": ");
    std::operator<<(poVar4,(string *)s);
  }
  else {
    poVar4 = std::operator<<(local_1b0,"  | ");
    poVar4 = std::operator<<(poVar4,"line ");
    iVar2 = Lineno::lineno(&ln);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,": ");
    std::operator<<(poVar4,(string *)s);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

static string errormsg(string s) {
    // cout << ln.start() << " " << ln.next() << '\n';
    string temp;
    std::stringstream ss(temp);
    // if there is a syntax error
    if ( ln.start() < ln.next() ) {
        ss << "  | ";
        for (int i = 0; i < ln.start() - 1 ; i++ ) {
            ss << ' ';
        }
        for (int i = ln.start(); i < ln.next(); i++ ) {
            ss << '^';
        }
        ss << "\n" << "  | " << "line " << ln.lineno() << "," 
           << ln.start() << ": " << s;
    } else {
        ss <<  "  | " << "line " << ln.lineno() << ": " << s;
    }
    return ss.str();
}